

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::DateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::QuarterOperator>
          (vector<duckdb::BaseStatistics,_true> *child_stats)

{
  bool bVar1;
  ulong uVar2;
  LogicalType *pLVar3;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  Value max_value;
  Value min_value;
  timestamp_t max_part;
  timestamp_t min_part;
  date_t max;
  date_t min;
  value_type *nstats;
  nullptr_t in_stack_fffffffffffffe98;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> this;
  LogicalType local_150 [24];
  BaseStatistics local_138 [32];
  BaseStatistics *in_stack_fffffffffffffee8;
  Value local_c8 [64];
  int64_t local_88;
  Value local_80 [68];
  int32_t local_3c;
  int64_t local_38;
  int32_t local_2c;
  int64_t local_28;
  date_t local_20;
  date_t local_1c;
  reference local_18;
  
  this._M_head_impl =
       (BaseStatistics *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  local_18 = vector<duckdb::BaseStatistics,_true>::operator[]
                       ((vector<duckdb::BaseStatistics,_true> *)
                        in_RDI._M_t.
                        super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                        .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                        (size_type)in_stack_fffffffffffffe98);
  uVar2 = duckdb::NumericStats::HasMinMax(local_18);
  if ((uVar2 & 1) == 0) {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)this._M_head_impl,in_stack_fffffffffffffe98);
  }
  else {
    local_1c = NumericStats::GetMin<duckdb::date_t>(in_stack_fffffffffffffee8);
    local_20 = NumericStats::GetMax<duckdb::date_t>(in_stack_fffffffffffffee8);
    bVar1 = date_t::operator>(&local_1c,&local_20);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)this._M_head_impl,in_stack_fffffffffffffe98);
    }
    else {
      local_2c = local_1c.days;
      local_28 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::QuarterOperator>
                                    ((date_t)(int32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      local_3c = local_20.days;
      local_38 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::QuarterOperator>
                                    ((date_t)(int32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      local_88 = local_28;
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_80);
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_c8);
      pLVar3 = Value::type(local_80);
      duckdb::LogicalType::LogicalType(local_150,pLVar3);
      duckdb::NumericStats::CreateEmpty(local_138,local_150);
      duckdb::LogicalType::~LogicalType(local_150);
      duckdb::NumericStats::SetMin(local_138,local_80);
      duckdb::NumericStats::SetMax(local_138,local_c8);
      vector<duckdb::BaseStatistics,_true>::operator[]
                ((vector<duckdb::BaseStatistics,_true> *)this._M_head_impl,
                 (size_type)in_stack_fffffffffffffe98);
      duckdb::BaseStatistics::CopyValidity(local_138);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_138);
      duckdb::Value::~Value(local_c8);
      duckdb::Value::~Value(local_80);
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> DateTruncStatistics(vector<BaseStatistics> &child_stats) {
	// we can only propagate date stats if the child has stats
	auto &nstats = child_stats[1];
	if (!NumericStats::HasMinMax(nstats)) {
		return nullptr;
	}
	// run the operator on both the min and the max, this gives us the [min, max] bound
	auto min = NumericStats::GetMin<TA>(nstats);
	auto max = NumericStats::GetMax<TA>(nstats);
	if (min > max) {
		return nullptr;
	}

	// Infinite values are unmodified
	auto min_part = DateTrunc::UnaryFunction<TA, TR, OP>(min);
	auto max_part = DateTrunc::UnaryFunction<TA, TR, OP>(max);

	auto min_value = Value::CreateValue(min_part);
	auto max_value = Value::CreateValue(max_part);
	auto result = NumericStats::CreateEmpty(min_value.type());
	NumericStats::SetMin(result, min_value);
	NumericStats::SetMax(result, max_value);
	result.CopyValidity(child_stats[0]);
	return result.ToUnique();
}